

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

bool __thiscall
Sphere::Intersect(Sphere *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Sphere *this_00;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  Vec3 _center;
  Vec3 oc;
  undefined1 local_a0 [24];
  Vec3 local_88;
  undefined1 local_78 [20];
  Vec3 local_64;
  float local_58;
  Vec3 local_3c;
  undefined1 auVar6 [16];
  
  local_a0._16_4_ = t_max;
  local_a0._20_4_ = t_min;
  GetCenter((Sphere *)&local_64,ray->m_time);
  local_a0._0_8_ = *(undefined8 *)(ray->m_origin).e;
  local_a0._8_4_ = (ray->m_origin).e[2];
  operator-((Vec3 *)local_a0,&local_64);
  local_a0._0_8_ = *(undefined8 *)(ray->m_direction).e;
  local_a0._8_4_ = (ray->m_direction).e[2];
  local_88.e._0_8_ = local_a0._0_8_;
  local_88.e[2] = (float)local_a0._8_4_;
  local_58 = dot((Vec3 *)local_a0,&local_88);
  local_a0._0_8_ = *(undefined8 *)(ray->m_direction).e;
  local_a0._8_4_ = (ray->m_direction).e[2];
  local_78._0_4_ = dot(&local_3c,(Vec3 *)local_a0);
  local_78._4_4_ = extraout_XMM0_Db;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._12_4_ = extraout_XMM0_Dd;
  fVar3 = dot(&local_3c,&local_3c);
  fVar3 = (float)local_78._0_4_ * (float)local_78._0_4_ -
          (fVar3 - this->m_radius * this->m_radius) * local_58;
  if (fVar3 <= 0.0) {
    bVar2 = false;
  }
  else {
    auVar7._0_8_ = (Material *)(local_78._0_8_ ^ 0x8000000080000000);
    auVar7._8_4_ = local_78._8_4_ ^ 0x80000000;
    auVar7._12_4_ = -(float)local_78._12_4_;
    if (fVar3 < 0.0) {
      local_78._0_16_ = auVar7;
      fVar3 = sqrtf(fVar3);
      uVar4 = extraout_XMM0_Db_00;
      auVar7._0_8_ = (Material *)local_78._0_8_;
    }
    else {
      fVar3 = SQRT(fVar3);
      uVar4 = local_78._4_4_;
    }
    auVar6._8_4_ = (int)((ulong)auVar7._0_8_ >> 0x20);
    auVar6._0_8_ = auVar7._0_8_;
    auVar6._12_4_ = uVar4;
    auVar5._8_8_ = auVar6._8_8_;
    auVar5._0_4_ = SUB84(auVar7._0_8_,0);
    auVar5._4_4_ = fVar3;
    auVar1._4_4_ = local_58;
    auVar1._0_4_ = local_58;
    auVar1._8_4_ = local_58;
    auVar1._12_4_ = local_58;
    auVar7 = divps(auVar5,auVar1);
    fVar3 = auVar7._0_4_ - auVar7._4_4_;
    if (((float)local_a0._16_4_ <= fVar3) || (fVar3 <= (float)local_a0._20_4_)) {
      fVar3 = auVar7._4_4_ + auVar7._0_4_;
      if ((float)local_a0._16_4_ <= fVar3) {
        return false;
      }
      if (fVar3 <= (float)local_a0._20_4_) {
        return false;
      }
      hit_record->m_t = fVar3;
      operator*(fVar3,(Vec3 *)local_a0);
      operator+(&ray->m_origin,(Vec3 *)local_a0);
      (hit_record->m_point).e[2] = local_88.e[2];
      *(undefined8 *)(hit_record->m_point).e = local_88.e._0_8_;
      operator-(&hit_record->m_point,&local_64);
      this_00 = (Sphere *)local_a0;
      operator/((Vec3 *)this_00,this->m_radius);
    }
    else {
      hit_record->m_t = fVar3;
      operator*(fVar3,(Vec3 *)local_a0);
      operator+(&ray->m_origin,(Vec3 *)local_a0);
      (hit_record->m_point).e[2] = local_88.e[2];
      *(undefined8 *)(hit_record->m_point).e = local_88.e._0_8_;
      operator-(&hit_record->m_point,&local_64);
      this_00 = (Sphere *)local_a0;
      operator/((Vec3 *)this_00,this->m_radius);
    }
    (hit_record->m_normal).e[2] = (float)local_a0._8_4_;
    *(undefined8 *)(hit_record->m_normal).e = local_a0._0_8_;
    hit_record->m_material = this->m_material;
    GetUV(this_00,&hit_record->m_normal,&hit_record->m_u,&hit_record->m_v);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
Sphere::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const
{
    Vec3  _center = GetCenter(ray.GetTime());

    Vec3  oc = ray.GetOrigin() - _center;
    float a  = dot(ray.GetDirection(), ray.GetDirection());
    float b  = dot(oc, ray.GetDirection());
    float c  = dot(oc, oc) - m_radius*m_radius;
    float discriminant = b*b - a*c;

    if (discriminant > 0) {
        float _t;
        float _neg_ba  = -b/a;
        float _sqrt_da = sqrt(discriminant)/a;
        
        _t = _neg_ba - _sqrt_da;
        if (_t < t_max && _t > t_min) {

            hit_record.m_t        = _t;
            hit_record.m_point    = ray.GetPoint(_t);
            hit_record.m_normal   = (hit_record.m_point - _center) / m_radius;
            hit_record.m_material = m_material;
			GetUV(hit_record.m_normal, hit_record.m_u, hit_record.m_v);

            return true;
        }
        
        _t = _neg_ba + _sqrt_da;
        if (_t < t_max && _t > t_min) {

            hit_record.m_t        = _t;
            hit_record.m_point    = ray.GetPoint(_t);
            hit_record.m_normal   = (hit_record.m_point - _center) / m_radius;
            hit_record.m_material = m_material;
			GetUV(hit_record.m_normal, hit_record.m_u, hit_record.m_v);

            return true;
        }
    }
    return false;
}